

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

WordType llvm::APInt::tcSubtract(WordType *dst,WordType *rhs,WordType c,uint parts)

{
  ulong uVar1;
  bool bVar2;
  WordType l;
  uint i;
  uint parts_local;
  WordType c_local;
  WordType *rhs_local;
  WordType *dst_local;
  
  if (c < 2) {
    _i = c;
    for (l._0_4_ = 0; (uint)l < parts; l._0_4_ = (uint)l + 1) {
      uVar1 = dst[(uint)l];
      if (_i == 0) {
        dst[(uint)l] = dst[(uint)l] - rhs[(uint)l];
        bVar2 = uVar1 < dst[(uint)l];
      }
      else {
        dst[(uint)l] = dst[(uint)l] - (rhs[(uint)l] + 1);
        bVar2 = uVar1 <= dst[(uint)l];
      }
      _i = (WordType)bVar2;
    }
    return _i;
  }
  __assert_fail("c <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x91d,
                "static APInt::WordType llvm::APInt::tcSubtract(WordType *, const WordType *, WordType, unsigned int)"
               );
}

Assistant:

APInt::WordType APInt::tcSubtract(WordType *dst, const WordType *rhs,
                                  WordType c, unsigned parts) {
  assert(c <= 1);

  for (unsigned i = 0; i < parts; i++) {
    WordType l = dst[i];
    if (c) {
      dst[i] -= rhs[i] + 1;
      c = (dst[i] >= l);
    } else {
      dst[i] -= rhs[i];
      c = (dst[i] > l);
    }
  }

  return c;
}